

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bbands.c
# Opt level: O3

ErrorNumber test_func_bbands(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  TA_Test_conflict4 *pTVar6;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  ulong local_48;
  TA_Test_conflict4 *local_40;
  TA_Real *local_38;
  
  pTVar6 = tableTest;
  uVar4 = 0;
  while( true ) {
    if ((int)history->nbBars < pTVar6->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_bbands.c"
             ,uVar4 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,0);
    if (TVar1 != TA_SUCCESS) {
      uVar5 = 0x8a;
      goto LAB_001160c9;
    }
    clearAllBuffers();
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    setInputBuffer(2,history->close,history->nbBars);
    setInputBuffer(3,history->close,history->nbBars);
    TA_SetCompatibility(pTVar6->compatibility);
    TVar1 = TA_BBANDS(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,pTVar6->optInTimePeriod,
                      pTVar6->optInNbDevUp,pTVar6->optInNbDevDn,pTVar6->optInMethod_3,&outBegIdx,
                      &outNbElement,gBuffer[0].out0,gBuffer[0].out1,gBuffer[0].out2);
    EVar2 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
    if (EVar2 != TA_TEST_PASS) {
      uVar5 = (ulong)EVar2;
      goto LAB_001160c9;
    }
    local_48 = uVar4;
    EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal0,
                               pTVar6->oneOfTheExpectedOutRealIndex0);
    uVar3 = 0;
    if (EVar2 != TA_TEST_PASS) break;
    EVar2 = checkExpectedValue(gBuffer[0].out1,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal1,
                               pTVar6->oneOfTheExpectedOutRealIndex1);
    if (EVar2 != TA_TEST_PASS) {
LAB_0011609d:
      uVar5 = (ulong)EVar2;
      uVar3 = 1;
      goto LAB_001160af;
    }
    EVar2 = checkExpectedValue(gBuffer[0].out2,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal2,
                               pTVar6->oneOfTheExpectedOutRealIndex2);
    if (EVar2 != TA_TEST_PASS) {
LAB_001160a7:
      uVar5 = (ulong)EVar2;
      uVar3 = 2;
      goto LAB_001160af;
    }
    outNbElement = 0;
    outBegIdx = 0;
    TVar1 = TA_BBANDS(pTVar6->startIdx,pTVar6->endIdx,gBuffer[1].in,pTVar6->optInTimePeriod,
                      pTVar6->optInNbDevUp,pTVar6->optInNbDevDn,pTVar6->optInMethod_3,&outBegIdx,
                      &outNbElement,gBuffer[1].in,gBuffer[1].out1,gBuffer[1].out2);
    EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
    if (EVar2 != TA_TEST_PASS) {
LAB_001160c1:
      uVar5 = (ulong)EVar2;
      uVar4 = local_48;
      goto LAB_001160c9;
    }
    EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal0,
                               pTVar6->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) break;
    EVar2 = checkExpectedValue(gBuffer[1].out1,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal1,
                               pTVar6->oneOfTheExpectedOutRealIndex1);
    if (EVar2 != TA_TEST_PASS) goto LAB_0011609d;
    EVar2 = checkExpectedValue(gBuffer[1].out2,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal2,
                               pTVar6->oneOfTheExpectedOutRealIndex2);
    if (EVar2 != TA_TEST_PASS) goto LAB_001160a7;
    outNbElement = 0;
    outBegIdx = 0;
    TVar1 = TA_BBANDS(pTVar6->startIdx,pTVar6->endIdx,gBuffer[2].in,pTVar6->optInTimePeriod,
                      pTVar6->optInNbDevUp,pTVar6->optInNbDevDn,pTVar6->optInMethod_3,&outBegIdx,
                      &outNbElement,gBuffer[2].out1,gBuffer[2].in,gBuffer[2].out2);
    EVar2 = checkSameContent(gBuffer[1].out1,gBuffer[2].in);
    if (EVar2 != TA_TEST_PASS) goto LAB_001160c1;
    EVar2 = checkExpectedValue(gBuffer[2].out1,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal0,
                               pTVar6->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) break;
    EVar2 = checkExpectedValue(gBuffer[2].in,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal1,
                               pTVar6->oneOfTheExpectedOutRealIndex1);
    if (EVar2 != TA_TEST_PASS) goto LAB_0011609d;
    EVar2 = checkExpectedValue(gBuffer[2].out2,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal2,
                               pTVar6->oneOfTheExpectedOutRealIndex2);
    if (EVar2 != TA_TEST_PASS) goto LAB_001160a7;
    outNbElement = 0;
    outBegIdx = 0;
    TVar1 = TA_BBANDS(pTVar6->startIdx,pTVar6->endIdx,gBuffer[3].in,pTVar6->optInTimePeriod,
                      pTVar6->optInNbDevUp,pTVar6->optInNbDevDn,pTVar6->optInMethod_3,&outBegIdx,
                      &outNbElement,gBuffer[3].out0,gBuffer[3].out1,gBuffer[3].in);
    EVar2 = checkSameContent(gBuffer[2].out2,gBuffer[3].in);
    if (EVar2 != TA_TEST_PASS) goto LAB_001160c1;
    EVar2 = checkExpectedValue(gBuffer[3].out0,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal0,
                               pTVar6->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) break;
    EVar2 = checkExpectedValue(gBuffer[3].out1,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal1,
                               pTVar6->oneOfTheExpectedOutRealIndex1);
    if (EVar2 != TA_TEST_PASS) goto LAB_0011609d;
    EVar2 = checkExpectedValue(gBuffer[3].in,TVar1,pTVar6->expectedRetCode,outBegIdx,
                               pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                               pTVar6->oneOfTheExpectedOutReal2,
                               pTVar6->oneOfTheExpectedOutRealIndex2);
    if (EVar2 != TA_TEST_PASS) goto LAB_001160a7;
    local_38 = history->close;
    local_40 = pTVar6;
    if ((pTVar6->doRangeTestFlag != 0) &&
       (EVar2 = doRangeTest(rangeTestFunction,-(uint)(pTVar6->optInMethod_3 != 1) | TA_FUNC_UNST_EMA
                            ,&local_40,3,0), EVar2 != TA_TEST_PASS)) goto LAB_001160c1;
    uVar4 = local_48 + 1;
    pTVar6 = pTVar6 + 1;
    if (uVar4 == 0x13) {
      return TA_TEST_PASS;
    }
  }
  uVar5 = (ulong)EVar2;
LAB_001160af:
  printf("Fail for output id=%d\n",(ulong)uVar3);
  uVar4 = local_48;
LAB_001160c9:
  printf("%s Failed Test #%d (Code=%d)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_bbands.c"
         ,uVar4 & 0xffffffff,uVar5);
  return (ErrorNumber)uVar5;
}

Assistant:

ErrorNumber test_func_bbands( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i,
                 tableTest[i].expectedNbElement,
                 history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__, i, retValue );
         return retValue;
      }
   }

   /* All test succeed. */
   return TA_TEST_PASS;
}